

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O3

void __thiscall FVoxel::Remap(FVoxel *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  BYTE *pBVar4;
  ulong uVar5;
  int i;
  long lVar6;
  byte *pbVar7;
  
  pBVar4 = this->Palette;
  if (pBVar4 != (BYTE *)0x0) {
    if ((GetVoxelRemap(unsigned_char_const*)::firsttime != '\x01') ||
       (iVar2 = bcmp(&GetVoxelRemap(unsigned_char_const*)::oldpal,pBVar4,0x300), iVar2 != 0)) {
      GetVoxelRemap(unsigned_char_const*)::firsttime = '\x01';
      memcpy(&GetVoxelRemap(unsigned_char_const*)::oldpal,pBVar4,0x300);
      pbVar7 = &DAT_00abafe2;
      lVar6 = 0;
      do {
        iVar2 = BestColor((uint32 *)&GPalette,(uint)(pbVar7[-2] >> 4) | (uint)pbVar7[-2] * 4,
                          (uint)(pbVar7[-1] >> 4) | (uint)pbVar7[-1] * 4,
                          (uint)(*pbVar7 >> 4) | (uint)*pbVar7 * 4,1,0xff);
        (&GetVoxelRemap(unsigned_char_const*)::remap)[lVar6] = (char)iVar2;
        lVar6 = lVar6 + 1;
        pbVar7 = pbVar7 + 3;
      } while (lVar6 != 0x100);
    }
    iVar2 = this->NumMips;
    if (0 < iVar2) {
      lVar6 = 0;
      do {
        iVar3 = this->Mips[lVar6].OffsetX[this->Mips[lVar6].SizeX];
        if (2 < iVar3) {
          pBVar4 = this->Mips[lVar6].SlabData;
          do {
            bVar1 = pBVar4[1];
            if (bVar1 != 0) {
              uVar5 = 0;
              do {
                pBVar4[uVar5 + 3] = (&GetVoxelRemap(unsigned_char_const*)::remap)[pBVar4[uVar5 + 3]]
                ;
                uVar5 = uVar5 + 1;
              } while (bVar1 != uVar5);
            }
            pBVar4 = pBVar4 + (ulong)bVar1 + 3;
            iVar3 = iVar3 - (bVar1 + 3);
          } while (2 < iVar3);
          iVar2 = this->NumMips;
        }
        lVar6 = lVar6 + 1;
      } while (lVar6 < iVar2);
    }
    if (this->Palette != (BYTE *)0x0) {
      operator_delete__(this->Palette);
      this->Palette = (BYTE *)0x0;
    }
    return;
  }
  return;
}

Assistant:

void FVoxel::Remap()
{
	if (Palette != NULL)
	{
		BYTE *remap = GetVoxelRemap(Palette);
		for (int i = 0; i < NumMips; ++i)
		{
			RemapVoxelSlabs((kvxslab_t *)Mips[i].SlabData, Mips[i].OffsetX[Mips[i].SizeX], remap);
		}
		RemovePalette();
	}
}